

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

void __thiscall
phyr::SurfaceInteraction::SurfaceInteraction
          (SurfaceInteraction *this,Point3f *p,Vector3f *wo,Vector3f *pfError,Point2f *uv,
          Vector3f *dpdu,Vector3f *dpdv,Normal3f *dndu,Normal3f *dndv,Shape *shape)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = dpdv->z * dpdu->y - dpdu->z * dpdv->y;
  dVar2 = dpdv->x * dpdu->z - dpdu->x * dpdv->z;
  dVar5 = dpdu->x * dpdv->y - dpdv->x * dpdu->y;
  dVar4 = 1.0 / SQRT(dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2);
  (this->super_Interaction).p.z = p->z;
  dVar3 = p->y;
  (this->super_Interaction).p.x = p->x;
  (this->super_Interaction).p.y = dVar3;
  (this->super_Interaction).n.x = dVar4 * dVar1;
  (this->super_Interaction).n.y = dVar4 * dVar2;
  (this->super_Interaction).n.z = dVar5 * dVar4;
  (this->super_Interaction).wo.z = wo->z;
  dVar3 = wo->y;
  (this->super_Interaction).wo.x = wo->x;
  (this->super_Interaction).wo.y = dVar3;
  (this->super_Interaction).pfError.z = pfError->z;
  dVar3 = pfError->y;
  (this->super_Interaction).pfError.x = pfError->x;
  (this->super_Interaction).pfError.y = dVar3;
  dVar3 = uv->y;
  (this->uv).x = uv->x;
  (this->uv).y = dVar3;
  (this->dpdu).z = dpdu->z;
  dVar3 = dpdu->y;
  (this->dpdu).x = dpdu->x;
  (this->dpdu).y = dVar3;
  (this->dpdv).z = dpdv->z;
  dVar3 = dpdv->y;
  (this->dpdv).x = dpdv->x;
  (this->dpdv).y = dVar3;
  (this->dndu).z = dndu->z;
  dVar3 = dndu->y;
  (this->dndu).x = dndu->x;
  (this->dndu).y = dVar3;
  (this->dndv).z = dndv->z;
  dVar3 = dndv->y;
  (this->dndv).x = dndv->x;
  (this->dndv).y = dVar3;
  this->bsdf = (BSDF *)0x0;
  this->shape = shape;
  memset(&this->object,0,0xd0);
  (this->shadingGeom).n.z = (this->super_Interaction).n.z;
  dVar3 = (this->super_Interaction).n.y;
  (this->shadingGeom).n.x = (this->super_Interaction).n.x;
  (this->shadingGeom).n.y = dVar3;
  (this->shadingGeom).dpdu.z = dpdu->z;
  dVar3 = dpdu->y;
  (this->shadingGeom).dpdu.x = dpdu->x;
  (this->shadingGeom).dpdu.y = dVar3;
  (this->shadingGeom).dpdv.z = dpdv->z;
  dVar3 = dpdv->y;
  (this->shadingGeom).dpdv.x = dpdv->x;
  (this->shadingGeom).dpdv.y = dVar3;
  dVar3 = dndu->y;
  (this->shadingGeom).dndu.x = dndu->x;
  (this->shadingGeom).dndu.y = dVar3;
  (this->shadingGeom).dndu.z = dndu->z;
  dVar3 = dndv->y;
  (this->shadingGeom).dndv.x = dndv->x;
  (this->shadingGeom).dndv.y = dVar3;
  (this->shadingGeom).dndv.z = dndv->z;
  (this->shadingGeom).overridesOrientation = false;
  if ((shape != (Shape *)0x0) && (shape->reverseNormals != shape->transformChangesCoordSys)) {
    (this->super_Interaction).n.x = -(dVar4 * dVar1);
    (this->super_Interaction).n.y = -(dVar4 * dVar2);
    (this->super_Interaction).n.z = -(dVar5 * dVar4);
    dVar1 = (this->shadingGeom).n.z;
    dVar2 = (this->shadingGeom).n.y;
    (this->shadingGeom).n.x = -(this->shadingGeom).n.x;
    (this->shadingGeom).n.y = -dVar2;
    (this->shadingGeom).n.z = -dVar1;
  }
  return;
}

Assistant:

SurfaceInteraction::SurfaceInteraction(const Point3f& p,
                   const Vector3f& wo, const Vector3f& pfError,
                   const Point2f& uv, const Vector3f& dpdu, const Vector3f& dpdv,
                   const Normal3f& dndu, const Normal3f& dndv, const Shape* shape) :
    Interaction(p, normalize(Normal3f(cross(dpdu, dpdv))), wo, pfError), uv(uv), dpdu(dpdu),
    dpdv(dpdv), dndu(dndu), dndv(dndv), shape(shape) {
    // Initialize shading geometry from true geometry
    shadingGeom.n = n;
    shadingGeom.dpdu = dpdu; shadingGeom.dpdv = dpdv;
    shadingGeom.dndu = dndu; shadingGeom.dndv = dndv;
    shadingGeom.overridesOrientation = false;

    // Adjust normals if either shape assumes reversed normals
    // or shape transformation changes coordinate system but not both
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys)) {
        // Flip normals
        n = -n; shadingGeom.n = -shadingGeom.n;
    }
}